

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O3

ChEnumMapper<chrono::ChSolverADMM::AdmmStepType> * __thiscall
chrono::my_enum_mappers::AdmmStepType_mapper::operator()
          (ChEnumMapper<chrono::ChSolverADMM::AdmmStepType> *__return_storage_ptr__,
          AdmmStepType_mapper *this,AdmmStepType *mval)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  
  peVar1 = (this->super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>).enummap.
           super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (this->super_ChEnumMapper<chrono::ChSolverADMM::AdmmStepType>).enummap.
            super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->super_ChEnumMapperBase)._vptr_ChEnumMapperBase =
         (_func_int **)&PTR_GetValueAsInt_00b3a780;
    __return_storage_ptr__->value_ptr = (AdmmStepType *)0x0;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_007c7deb;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar2 = __libc_single_threaded != '\0';
    (__return_storage_ptr__->super_ChEnumMapperBase)._vptr_ChEnumMapperBase =
         (_func_int **)&PTR_GetValueAsInt_00b3a780;
    __return_storage_ptr__->value_ptr = (AdmmStepType *)0x0;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this_00;
    if (bVar2) goto LAB_007c7ddc;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (__return_storage_ptr__->super_ChEnumMapperBase)._vptr_ChEnumMapperBase =
         (_func_int **)&PTR_GetValueAsInt_00b3a780;
    __return_storage_ptr__->value_ptr = (AdmmStepType *)0x0;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar1;
    (__return_storage_ptr__->enummap).
    super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolverADMM::AdmmStepType>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this_00;
LAB_007c7ddc:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_007c7deb:
  __return_storage_ptr__->value_ptr = mval;
  return __return_storage_ptr__;
}

Assistant:

void ChSolverADMM::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSolverADMM>();
    // serialize parent class
    ChIterativeSolverVI::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(precond);
    marchive << CHNVP(rho);
    marchive << CHNVP(rho_b);
    marchive << CHNVP(sigma);
    marchive << CHNVP(stepadjust_each);
    marchive << CHNVP(stepadjust_threshold);
    marchive << CHNVP(stepadjust_maxfactor);
    marchive << CHNVP(tol_prim);
    marchive << CHNVP(tol_dual);
    my_enum_mappers::AdmmStepType_mapper mmapper;
    marchive << CHNVP(mmapper(this->stepadjust_type), "stepadjust_type");
}